

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void runtime(void)

{
  ostream *poVar1;
  ofstream ppm;
  OutputImage<cert::Color,_120UL,_120UL> local_a8c8;
  
  std::ofstream::ofstream(&ppm,"output_runtime.ppm",_S_out);
  poVar1 = std::operator<<((ostream *)&ppm,"P3\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  std::operator<<(poVar1,"\n255\n");
  cert::raytrace<120ul,120ul,120ul,120ul,0ul,0ul,3ul>();
  print_image<cert::OutputImage<cert::Color,120ul,120ul>>(&ppm,&local_a8c8);
  std::ofstream::~ofstream(&ppm);
  return;
}

Assistant:

void runtime ()
{
	std::ofstream ppm ("output_runtime.ppm");
	ppm << "P3\n" << width << " " << height << "\n255\n";
	print_image (ppm, cert::raytrace<width, height, width, height, 0, 0, samples> ());
}